

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagParser::parse(TagParser *this,string *str)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  string local_50 [32];
  ulong local_30;
  size_t end;
  ulong uStack_20;
  char c;
  size_t pos;
  string *str_local;
  TagParser *this_local;
  
  pos = (size_t)str;
  str_local = (string *)this;
  for (uStack_20 = 0; uVar1 = uStack_20, uVar2 = std::__cxx11::string::size(), uVar1 < uVar2;
      uStack_20 = uStack_20 + 1) {
    auVar3 = std::__cxx11::string::operator[](pos);
    end._7_1_ = *auVar3._0_8_;
    if (end._7_1_ == '[') {
      auVar3 = std::__cxx11::string::find_first_of((char)pos,0x5d);
      local_30 = auVar3._0_8_;
      if (local_30 == 0xffffffffffffffff) {
        (*this->_vptr_TagParser[3])
                  (this,(ulong)(uint)(int)end._7_1_,auVar3._8_8_,
                   CONCAT71((int7)(uVar2 >> 8),end._7_1_));
      }
      else {
        std::__cxx11::string::substr((ulong)local_50,pos);
        (*this->_vptr_TagParser[2])(this,local_50);
        std::__cxx11::string::~string(local_50);
        uStack_20 = local_30;
      }
    }
    else {
      (*this->_vptr_TagParser[3])
                (this,(ulong)(uint)(int)end._7_1_,auVar3._8_8_,
                 CONCAT71((int7)(uVar2 >> 8),end._7_1_));
    }
  }
  (*this->_vptr_TagParser[4])();
  return;
}

Assistant:

void parse( const std::string& str ) {
            std::size_t pos = 0;
            while( pos < str.size() ) {
                char c = str[pos];
                if( c == '[' ) {
                    std::size_t end = str.find_first_of( ']', pos );
                    if( end != std::string::npos ) {
                        acceptTag( str.substr( pos+1, end-pos-1 ) );
                        pos = end+1;
                    }
                    else {
                        acceptChar( c );
                        pos++;
                    }
                }
                else {
                    acceptChar( c );
                    pos++;
                }
            }
            endParse();
        }